

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O1

void vera::extractVertexData
               (uint32_t v_pos,uint8_t *base,int accesor_componentType,int accesor_type,
               bool accesor_normalized,uint32_t byteStride,float *output,uint8_t max_num_comp)

{
  size_t __n;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  if (accesor_type < 4) {
    if (accesor_type == 2) {
      __n = 8;
    }
    else {
      if (accesor_type != 3) {
LAB_00292f36:
        __assert_fail("!\"invalid type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/io/gltf.cpp"
                      ,0x70,
                      "void vera::extractVertexData(uint32_t, const uint8_t *, int, int, bool, uint32_t, float *, uint8_t)"
                     );
      }
      __n = 0xc;
    }
  }
  else if (accesor_type == 4) {
    __n = 0x10;
  }
  else {
    __n = 4;
    if (accesor_type != 0x41) goto LAB_00292f36;
  }
  if (accesor_componentType == 0x1406) {
    memcpy(&local_18,base + byteStride * v_pos,__n);
    if (max_num_comp != '\0') {
      memcpy(output,&local_18,(ulong)max_num_comp << 2);
    }
    return;
  }
  __assert_fail("!\"Conversion Type from float to -> ??? not implemented yet\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/io/gltf.cpp"
                ,0x7c,
                "void vera::extractVertexData(uint32_t, const uint8_t *, int, int, bool, uint32_t, float *, uint8_t)"
               );
}

Assistant:

void extractVertexData(uint32_t v_pos, const uint8_t *base, int accesor_componentType, int accesor_type, bool accesor_normalized, uint32_t byteStride, float *output, uint8_t max_num_comp) {
    float v[4] = {0.0f, 0.0f, 0.0f, 0.0f};
    uint32_t ncomp = 1;
    switch (accesor_type) {
        case TINYGLTF_TYPE_SCALAR: ncomp = 1; break;
        case TINYGLTF_TYPE_VEC2:   ncomp = 2; break;
        case TINYGLTF_TYPE_VEC3:   ncomp = 3; break;
        case TINYGLTF_TYPE_VEC4:   ncomp = 4; break;
        default:
            assert(!"invalid type");
    }
    switch (accesor_componentType) {
        case TINYGLTF_COMPONENT_TYPE_FLOAT: {
            const float *data = (float*)(base+byteStride*v_pos);
            for (uint32_t i = 0; (i < ncomp); ++i) {
                v[i] = data[i];
            }
        }
        // TODO SUPPORT OTHER FORMATS
        break;
        default:
            assert(!"Conversion Type from float to -> ??? not implemented yet");
            break;
    }
    for (uint32_t i = 0; i < max_num_comp; ++i) {
        output[i] = v[i];
    }
}